

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O3

bool __thiscall Chainstate::NeedsRedownload(Chainstate *this)

{
  pointer ppCVar1;
  bool bVar2;
  CBlockIndex *pCVar3;
  long in_FS_OFFSET;
  
  ppCVar1 = (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if ((ppCVar1 !=
       (this->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>.
       _M_impl.super__Vector_impl_data._M_start) &&
     (pCVar3 = ppCVar1[-1], pCVar3 != (CBlockIndex *)0x0)) {
    do {
      if (pCVar3->nHeight < (((this->m_chainman->m_options).chainparams)->consensus).SegwitHeight)
      break;
      if ((pCVar3->nStatus & 0x80) == 0) {
        bVar2 = true;
        goto LAB_00ae75f6;
      }
      pCVar3 = pCVar3->pprev;
    } while (pCVar3 != (CBlockIndex *)0x0);
  }
  bVar2 = false;
LAB_00ae75f6:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Chainstate::NeedsRedownload() const
{
    AssertLockHeld(cs_main);

    // At and above m_params.SegwitHeight, segwit consensus rules must be validated
    CBlockIndex* block{m_chain.Tip()};

    while (block != nullptr && DeploymentActiveAt(*block, m_chainman, Consensus::DEPLOYMENT_SEGWIT)) {
        if (!(block->nStatus & BLOCK_OPT_WITNESS)) {
            // block is insufficiently validated for a segwit client
            return true;
        }
        block = block->pprev;
    }

    return false;
}